

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  ushort uVar1;
  uint k;
  CTSize CVar2;
  CTState *pCVar3;
  TraceError e;
  byte bVar4;
  IRRef1 IVar5;
  ushort uVar6;
  IRType IVar7;
  IRType IVar8;
  TRef TVar9;
  uint uVar10;
  CTypeID CVar11;
  TRef TVar12;
  GCcdata *pGVar13;
  ulong uVar14;
  CType *pCVar15;
  IRRef1 IVar16;
  ushort uVar17;
  IRType IVar18;
  CType *ct;
  uint uVar19;
  IRRef1 IVar20;
  CTInfo CVar21;
  int32_t k_00;
  bool bVar22;
  bool bVar23;
  ulong uStack_60;
  double *local_48;
  CTSize ofs;
  
  pCVar3 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  uVar19 = sp >> 0x18 & 0x1f;
  if (4 < uVar19 - 0xf) {
    uVar10 = sp & 0x1f000000;
    if (uVar10 == 0xe000000) {
      uVar14 = sval->u64;
      uStack_60 = 0xe;
      goto LAB_0015410f;
    }
    if (uVar19 - 1 < 2) {
      sp = lj_ir_kint(J,(uint)(uVar10 == 0x2000000));
      uStack_60 = 3;
      local_48 = (double *)0x0;
      goto LAB_00154111;
    }
    uStack_60 = 0x11;
    if (uVar10 == 0) {
      sp = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
LAB_00154ba3:
      local_48 = (double *)0x0;
      goto LAB_00154111;
    }
    IVar16 = (IRRef1)sp;
    if (uVar10 == 0x4000000) {
      if ((d->info & 0xf0000000) == 0x50000000) {
        uVar14 = sval->u64;
        local_48 = (double *)0x0;
        pCVar15 = lj_ctype_getfieldq(pCVar3,d,&((GCobj *)(uVar14 & 0x7fffffffffff))->str,&ofs,
                                     (CTInfo *)0x0);
        TVar9 = lj_ir_kgc(J,(GCobj *)(uVar14 & 0x7fffffffffff),IRT_STR);
        (J->fold).ins.field_0.ot = 0x884;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        lj_opt_fold(J);
        uStack_60 = 0x11;
        if (pCVar15 != (CType *)0x0) {
          if ((pCVar15->info & 0xf0000000) == 0xb0000000) {
            local_48 = (double *)(ulong)(ofs != 0);
            sp = lj_ir_kint(J,ofs);
            uStack_60 = (ulong)(ushort)pCVar15->info;
          }
          else {
            local_48 = (double *)0x0;
          }
        }
        goto LAB_00154111;
      }
      if ((d->info & 0xfc000000) == 0x30000000) {
        e = LJ_TRERR_BADTYPE;
        goto LAB_00154cb0;
      }
      TVar9 = lj_ir_kint64(J,0x18);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar16;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      sp = lj_opt_fold(J);
      uStack_60 = 0x15;
      goto LAB_00154ba3;
    }
    if (uVar10 == 0xc000000) {
      uVar14 = sval->u64 & 0x7fffffffffff;
      if ((*(byte *)(uVar14 + 10) | 2) == 3) {
        (J->fold).ins.field_0.op1 = IVar16;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4510000c;
        TVar9 = lj_opt_fold(J);
        TVar12 = lj_ir_kint(J,(uint)*(byte *)(uVar14 + 10));
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        lj_opt_fold(J);
        IVar20 = 0xd;
        if (*(char *)(uVar14 + 10) != '\x01') {
          IVar20 = 0x13;
        }
        (J->fold).ins.field_0.ot = 0x4509;
        (J->fold).ins.field_0.op1 = IVar16;
      }
      else {
        TVar9 = lj_ir_kint64(J,0x30);
        IVar20 = (IRRef1)TVar9;
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar16;
      }
      (J->fold).ins.field_0.op2 = IVar20;
      sp = lj_opt_fold(J);
      goto LAB_00154ba3;
    }
    if (uVar10 != 0x3000000) {
      pGVar13 = argv2cdata(J,sp,sval);
      uVar1 = pGVar13->ctypeid;
      pCVar15 = pCVar3->tab;
      CVar21 = pCVar15[uVar1].info;
      uVar14 = sval->u64;
      if ((CVar21 & 0xf0000000) == 0x60000000) {
        CVar11 = lj_ctype_intern(pCVar3,uVar1 | 0x20030000,8);
        pCVar15 = pCVar3->tab;
        ct = pCVar15 + CVar11;
        CVar21 = pCVar15[CVar11].info;
        IVar7 = IRT_P64;
      }
      else {
        ct = pCVar15 + uVar1;
        IVar7 = crec_ct2irt(pCVar3,ct);
      }
      local_48 = (double *)((uVar14 & 0x7fffffffffff) + 0x10);
      uVar1 = (ushort)IVar7;
      if (CVar21 >> 0x1c == 2) {
        (J->fold).ins.field_0.ot = uVar1 | 0x4500;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = 0x15;
        sp = lj_opt_fold(J);
        if ((ct->info & 0xf0800000) == 0x20800000) {
          local_48 = (double *)*local_48;
          uVar14 = (ulong)(ct->info & 0xffff);
          uVar19 = pCVar3->tab[uVar14].info;
          if ((uVar19 & 0xf0000000) == 0x50000000) {
            uVar14 = (ulong)(uVar19 & 0xffff);
          }
          ct = pCVar3->tab + uVar14;
          IVar7 = crec_ct2irt(pCVar3,ct);
LAB_00154c57:
          if ((ct->info < 0x10000000) && (IVar7 != IRT_CDATA)) {
            (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x4600;
            (J->fold).ins.field_0.op1 = (IRRef1)sp;
            (J->fold).ins.field_0.op2 = 0;
            goto LAB_00154c89;
          }
        }
      }
      else {
        if (IVar7 - IRT_I64 < 2) {
          (J->fold).ins.field_0.ot = uVar1 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = 0x17;
        }
        else {
          if (1 < IVar7 - IRT_INT) {
            TVar9 = lj_ir_kint64(J,0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar16;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            sp = lj_opt_fold(J);
            goto LAB_00154c57;
          }
          if (CVar21 >> 0x1c == 5) {
            ct = pCVar15 + (CVar21 & 0xffff);
          }
          (J->fold).ins.field_0.ot = uVar1 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = 0x16;
        }
LAB_00154c89:
        sp = lj_opt_fold(J);
      }
      goto LAB_00154119;
    }
    goto switchD_001541db_caseD_3;
  }
  uVar14 = sval->u64;
  uStack_60 = 9;
LAB_0015410f:
  local_48 = (double *)(ulong)((uVar14 & 0x7fffffffffffffff) != 0);
LAB_00154111:
  ct = pCVar3->tab + uStack_60;
LAB_00154119:
  uVar19 = d->info;
  if ((uVar19 & 0xf0000000) == 0x50000000) {
    d = pCVar3->tab + (uVar19 & 0xffff);
    uVar19 = pCVar3->tab[uVar19 & 0xffff].info;
  }
  pCVar3 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  IVar7 = crec_ct2irt(pCVar3,d);
  IVar8 = crec_ct2irt(pCVar3,ct);
  if ((0x3fffffff < uVar19) || (uVar10 = ct->info, 0x3fffffff < uVar10))
  goto switchD_001541db_caseD_3;
  k = d->size;
  bVar4 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar10 >> 0x18) & 0x3c)) & 0xf) +
          ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar19 >> 0x18) & 0x3c)) & 0xf) * '\b';
  if (0x36 < bVar4) {
    if (bVar4 == 0x3f) goto switchD_001541db_caseD_36;
    goto switchD_001541db_caseD_3;
  }
  uVar19 = ct->size;
  IVar20 = (IRRef1)sp;
  uVar17 = (ushort)IVar8;
  IVar16 = (IRRef1)dp;
  uVar1 = (ushort)IVar7;
  switch(bVar4) {
  case 0:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 1:
  case 2:
    if (IVar8 == IRT_CDATA) goto switchD_001541db_caseD_3;
    if (IVar8 - IRT_FLOAT < 2) {
      TVar9 = lj_ir_knum_u64(J,0);
      IVar5 = (IRRef1)TVar9;
    }
    else if (IVar8 - IRT_I64 < 2) {
      TVar9 = lj_ir_kint64(J,0);
      IVar5 = (IRRef1)TVar9;
    }
    else {
      TVar9 = lj_ir_kint(J,0);
      IVar5 = (IRRef1)TVar9;
    }
    uVar6 = 0x800;
    k_00 = 0;
    if (local_48 == (double *)0x0) goto LAB_0015474c;
    if (local_48 == (double *)0x1) {
LAB_00154743:
      uVar6 = 0x900;
      k_00 = 1;
    }
    else {
      CVar2 = ct->size;
      if ((ct->info & 0x4000000) == 0) {
        if (CVar2 == 4) {
          if (*(float *)local_48 != 0.0) goto LAB_00154743;
        }
        else if (CVar2 == 2) {
          if (*(short *)local_48 != 0) goto LAB_00154743;
        }
        else if (CVar2 == 1) {
          k_00 = 0;
          if (*(char *)local_48 != '\0') goto LAB_00154743;
        }
        else if (*local_48 != 0.0) goto LAB_00154743;
      }
      else {
        if (CVar2 == 4) {
          bVar22 = NAN(*(float *)local_48);
          bVar23 = *(float *)local_48 == 0.0;
        }
        else {
          bVar22 = NAN(*local_48);
          bVar23 = *local_48 == 0.0;
        }
        if ((!bVar23) || (bVar22)) goto LAB_00154743;
      }
    }
LAB_0015474c:
    (J->fold).ins.field_0.ot = uVar6 | uVar17 | 0x80;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    sp = lj_ir_kint(J,k_00);
    break;
  case 8:
  case 9:
switchD_001541db_caseD_8:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001541db_caseD_3;
    if ((k == 8) && ((uVar19 < 8 && ((uVar10 & 0x800000) == 0)))) {
      uVar6 = uVar1 | 0x5b00;
      if (uVar19 < 4) {
        IVar8 = IRT_INT;
      }
      uVar17 = (ushort)(IVar7 << 5) | (ushort)IVar8 | 0x800;
      goto LAB_001545cb;
    }
    if ((7 < k) || (uVar19 != 8)) {
      if (IVar8 == IRT_INT) {
        sp = lj_opt_narrow_toint(J,sp);
      }
      break;
    }
    IVar18 = IRT_INT;
    if (3 < k) {
      IVar18 = IVar7;
    }
    uVar6 = (ushort)IVar18;
    uVar17 = (ushort)IVar8 | (ushort)(IVar18 << 5);
    goto LAB_00154643;
  case 10:
    goto switchD_001541db_caseD_a;
  case 0xb:
    (J->fold).ins.field_0.ot = uVar17 | 0x4600;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_001541db_caseD_a:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001541db_caseD_3;
    IVar8 = IRT_INT;
    if (3 < k) {
      IVar8 = IVar7;
    }
    uVar6 = (ushort)IVar8 | 0x5b00;
    uVar17 = (ushort)(IVar8 << 5) | uVar17 | 0x1000;
LAB_001545cb:
    (J->fold).ins.field_0.ot = uVar6;
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar17;
LAB_00154659:
    sp = lj_opt_fold(J);
    break;
  case 0xd:
  case 0xe:
    if ((k & 8) == 0) {
      uVar19 = 8;
      IVar8 = IRT_U64;
      uVar10 = 0x800000;
      goto switchD_001541db_caseD_8;
    }
    uVar6 = uVar1 | 0x5b00;
    uVar17 = (ushort)(IVar7 << 5) | 9;
    goto LAB_001545cb;
  case 0x10:
  case 0x11:
    goto switchD_001541db_caseD_10;
  case 0x12:
    goto switchD_001541db_caseD_12;
  case 0x13:
    (J->fold).ins.field_0.ot = uVar17 | 0x4600;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_001541db_caseD_12:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001541db_caseD_3;
    if (IVar7 == IVar8) break;
    uVar17 = uVar17 | (ushort)(IVar7 << 5);
    uVar6 = uVar1;
LAB_00154643:
    (J->fold).ins.field_0.ot = uVar6 | 0x5b00;
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar17;
    goto LAB_00154659;
  case 0x19:
  case 0x1a:
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    TVar12 = lj_ir_knum_u64(J,0);
    (J->fold).ins.field_0.ot = uVar1 | 0x4e00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    lj_opt_fold(J);
    if ((uVar10 >> 0x1a & 1) != 0) goto switchD_001541db_caseD_12;
switchD_001541db_caseD_10:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001541db_caseD_3;
    uVar6 = uVar1 | 0x5b00;
    if (uVar19 < 4) {
      IVar8 = IRT_INT;
    }
    uVar17 = (ushort)(IVar7 << 5) | (ushort)IVar8;
    goto LAB_001545cb;
  case 0x1b:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001541db_caseD_3;
    (J->fold).ins.field_0.ot = uVar17 | 0x4600;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar5 = (IRRef1)TVar9;
    TVar9 = lj_ir_kint64(J,(ulong)(uVar19 >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar17 | 0x4600;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar20 = (IRRef1)TVar9;
    if (IVar7 != IVar8) {
      uVar17 = uVar17 | (ushort)(IVar7 << 5);
      (J->fold).ins.field_0.ot = uVar1 | 0x5b00;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar9 = lj_opt_fold(J);
      IVar5 = (IRRef1)TVar9;
      (J->fold).ins.field_0.ot = uVar1 | 0x5b00;
      (J->fold).ins.field_0.op1 = IVar20;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar9 = lj_opt_fold(J);
      IVar20 = (IRRef1)TVar9;
    }
    (J->fold).ins.field_0.ot = uVar1 | 0x4e00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar1 | 0x4e00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = IVar20;
    goto LAB_0015468d;
  case 0x29:
    if (IVar8 == IRT_CDATA) goto switchD_001541db_caseD_3;
    break;
  case 0x2a:
    if (IVar8 != IRT_CDATA) {
      uVar6 = k == 8 | 0x5b14;
      uVar17 = (ushort)(k == 8) << 5 | uVar17 | 0x1280;
      goto LAB_001545cb;
    }
  default:
switchD_001541db_caseD_3:
    e = LJ_TRERR_NYICONV;
LAB_00154cb0:
    lj_trace_err(J,e);
  case 0x36:
switchD_001541db_caseD_36:
    if (dp == 0) goto switchD_001541db_caseD_3;
    TVar9 = lj_ir_kint(J,k);
    crec_copy(J,dp,sp,TVar9,d);
    goto LAB_00154692;
  }
  if (dp != 0) {
    (J->fold).ins.field_0.ot = uVar1 | 0x4e00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)sp;
LAB_0015468d:
    lj_opt_fold(J);
LAB_00154692:
    sp = 0;
  }
  return sp;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE || ud->udtype == UDTYPE_BUFFER) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, ud->udtype));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp,
		  ud->udtype == UDTYPE_IO_FILE ? IRFL_UDATA_FILE :
						 IRFL_SBUF_R);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lj_assertJ(ctype_child(cts, cct)->size == 4,
		   "only 32 bit const supported");  /* NYI */
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else if (tref_islightud(sp)) {
#if LJ_64
    lj_trace_err(J, LJ_TRERR_NYICONV);
#endif
  } else {  /* NYI: tref_istab(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    if (ctype_isfunc(s->info)) {
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      s = ctype_get(cts, sid);
      t = IRT_PTR;
    } else {
      t = crec_ct2irt(cts, s);
    }
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}